

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_fwrite(zip_t *zip,char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t bufsize;
  undefined1 auStack_100c8 [8];
  stat file_stat;
  mz_uint8 buf [65536];
  FILE *stream;
  size_t n;
  int status;
  char *filename_local;
  zip_t *zip_local;
  
  n._4_4_ = 0;
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else {
    memset(file_stat.__glibc_reserved + 2,0,0x10000);
    memset(auStack_100c8,0,0x90);
    iVar1 = stat(filename,(stat *)auStack_100c8);
    if (iVar1 == 0) {
      if (((uint)file_stat.st_nlink & 0x80) == 0) {
        (zip->entry).external_attr = (zip->entry).external_attr | 1;
      }
      (zip->entry).external_attr = (uint)file_stat.st_nlink << 0x10 | (zip->entry).external_attr;
      (zip->entry).m_time = file_stat.st_atim.tv_nsec;
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        zip_local._4_4_ = -1;
      }
      else {
        do {
          bufsize = fread(file_stat.__glibc_reserved + 2,1,0x10000,__stream);
          if (bufsize == 0) goto LAB_00bcb325;
          iVar1 = zip_entry_write(zip,file_stat.__glibc_reserved + 2,bufsize);
        } while (-1 < iVar1);
        n._4_4_ = -1;
LAB_00bcb325:
        fclose(__stream);
        zip_local._4_4_ = n._4_4_;
      }
    }
    else {
      zip_local._4_4_ = -1;
    }
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_fwrite(struct zip_t *zip, const char *filename) {
  int status = 0;
  size_t n = 0;
  FILE *stream = NULL;
  mz_uint8 buf[MZ_ZIP_MAX_IO_BUF_SIZE];
  struct MZ_FILE_STAT_STRUCT file_stat;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  memset(buf, 0, MZ_ZIP_MAX_IO_BUF_SIZE);
  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));
  if (MZ_FILE_STAT(filename, &file_stat) != 0) {
    // problem getting information - check errno
    return -1;
  }

  if ((file_stat.st_mode & 0200) == 0) {
    // MS-DOS read-only attribute
    zip->entry.external_attr |= 0x01;
  }
  zip->entry.external_attr |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);
  zip->entry.m_time = file_stat.st_mtime;

#if defined(_MSC_VER)
  if (fopen_s(&stream, filename, "rb"))
#else
  if (!(stream = fopen(filename, "rb")))
#endif
  {
    // Cannot open filename
    return -1;
  }

  while ((n = fread(buf, sizeof(mz_uint8), MZ_ZIP_MAX_IO_BUF_SIZE, stream)) >
         0) {
    if (zip_entry_write(zip, buf, n) < 0) {
      status = -1;
      break;
    }
  }
  fclose(stream);

  return status;
}